

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O1

int Nwk_ManPushBackwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = pObj->TravId;
  iVar1 = pObj->pMan->nTravIds;
  if (iVar3 == iVar1 || iVar3 == iVar1 + -1) {
    return 0;
  }
  iVar2 = iVar1 + -1;
  if ((iVar1 + -2 <= iVar3) && (iVar2 = iVar1, iVar3 != iVar1 + -2)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFlow.c"
                  ,0x52,"void Nwk_ObjSetVisitedTop(Nwk_Obj_t *)");
  }
  pObj->TravId = iVar2;
  if ((pObj->field_0x20 & 0x10) == 0) {
    if (0 < pObj->nFanins) {
      lVar4 = 0;
      do {
        if (pObj->pFanio[lVar4] == (Nwk_Obj_t *)0x0) break;
        iVar3 = Nwk_ManPushBackwardBot_rec(pObj->pFanio[lVar4],pPred);
        if (iVar3 != 0) {
          return 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pObj->nFanins);
    }
    if (0 < pObj->nFanouts) {
      lVar4 = 0;
      do {
        if (pObj->pFanio[pObj->nFanins + lVar4] == (Nwk_Obj_t *)0x0) break;
        if (((*(uint *)&pObj->field_0x20 & 7) != 2) &&
           (iVar3 = Nwk_ManPushBackwardTop_rec(pObj->pFanio[pObj->nFanins + lVar4],pPred),
           iVar3 != 0)) {
          return 1;
        }
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 < pObj->nFanouts);
    }
    if ((pObj->field_0x20 & 0x20) == 0) {
      return 0;
    }
    if ((Nwk_Obj_t *)pObj->pCopy == (Nwk_Obj_t *)0x0) {
      return 0;
    }
    iVar3 = Nwk_ManPushBackwardBot_rec(pObj,(Nwk_Obj_t *)pObj->pCopy);
    if (iVar3 == 0) {
      return 0;
    }
    pObj->field_0x20 = pObj->field_0x20 & 0xdf;
    pObj->pCopy = (void *)0x0;
  }
  return 1;
}

Assistant:

int Nwk_ManPushBackwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushBackwardBot_rec( pNext, pPred ) )
            return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( !Nwk_ObjIsCo(pObj) && Nwk_ManPushBackwardTop_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) )
        if ( Nwk_ObjPred(pObj) && Nwk_ManPushBackwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}